

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trmm.hpp
# Opt level: O0

void remora::bindings::
     trmm_impl<remora::dense_matrix_adaptor<double_const,remora::row_major,remora::dense_tag,remora::cpu_tag>,remora::matrix<double,remora::row_major,remora::cpu_tag>,remora::triangular_tag<false,false>>
               (matrix_expression<remora::dense_matrix_adaptor<const_double,_remora::row_major,_remora::dense_tag,_remora::cpu_tag>,_remora::cpu_tag>
                *param_1,
               matrix_expression<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
               *param_2)

{
  matrix_expression<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
  *pmVar1;
  int iVar2;
  dense_matrix_adaptor<const_double,_remora::row_major,_remora::dense_tag,_remora::cpu_tag> *this;
  matrix<double,_remora::row_major,_remora::cpu_tag> *this_00;
  unsigned_long *puVar3;
  type As;
  size_t mc;
  size_t i;
  size_t i_end;
  size_t i_start;
  type Bs;
  size_t kc;
  size_t k;
  size_t k0;
  size_t nc;
  size_t j;
  size_t stride2;
  size_t stride1;
  double *Bpointer;
  storage_type storageB;
  size_t Bb;
  size_t Ab;
  size_t N;
  size_t M;
  value_type *B;
  value_type *A;
  aligned_allocator<double,_64UL> allocator;
  pointer in_stack_fffffffffffffeb8;
  matrix<double,_remora::row_major,_remora::cpu_tag> *in_stack_fffffffffffffec0;
  size_t in_stack_fffffffffffffec8;
  size_t in_stack_fffffffffffffed0;
  const_void_pointer in_stack_fffffffffffffed8;
  dense_matrix_adaptor<double,_remora::row_major,_remora::dense_tag,_remora::cpu_tag>
  *in_stack_fffffffffffffee0;
  aligned_allocator<double,_64UL> *in_stack_fffffffffffffee8;
  size_t in_stack_fffffffffffffef0;
  unsigned_long in_stack_fffffffffffffef8;
  matrix_expression<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
  *in_stack_ffffffffffffff00;
  undefined1 local_e0 [32];
  unsigned_long local_c0;
  unsigned_long local_b8;
  matrix_expression<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
  *local_b0;
  matrix_expression<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
  *local_a8;
  unsigned_long local_a0;
  unsigned_long local_98;
  ulong local_90;
  int local_84;
  matrix<double,_remora::row_major,_remora::cpu_tag> *local_80;
  int local_74;
  pointer local_70;
  double *local_68;
  storage_type local_60;
  ulong local_50;
  matrix_expression<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
  *local_48;
  size_type local_40;
  size_type local_38;
  pointer local_30;
  pointer local_28;
  matrix_expression<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
  *local_18;
  matrix_expression<remora::dense_matrix_adaptor<const_double,_remora::row_major,_remora::dense_tag,_remora::cpu_tag>,_remora::cpu_tag>
  *local_10;
  
  local_18 = param_2;
  local_10 = param_1;
  local_28 = boost::alignment::aligned_allocator<double,_64UL>::allocate
                       (in_stack_fffffffffffffee8,(size_type)in_stack_fffffffffffffee0,
                        in_stack_fffffffffffffed8);
  local_30 = boost::alignment::aligned_allocator<double,_64UL>::allocate
                       (in_stack_fffffffffffffee8,(size_type)in_stack_fffffffffffffee0,
                        in_stack_fffffffffffffed8);
  this = matrix_expression<remora::dense_matrix_adaptor<const_double,_remora::row_major,_remora::dense_tag,_remora::cpu_tag>,_remora::cpu_tag>
         ::operator()(local_10);
  local_38 = dense_matrix_adaptor<const_double,_remora::row_major,_remora::dense_tag,_remora::cpu_tag>
             ::size1(this);
  this_00 = matrix_expression<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
            ::operator()(local_18);
  local_40 = matrix<double,_remora::row_major,_remora::cpu_tag>::size2(this_00);
  local_48 = (matrix_expression<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
              *)(local_38 + 0x7f >> 7);
  local_50 = (local_40 + 0x3fb) / 0x3fc;
  matrix_expression<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>::
  operator()(local_18);
  local_60 = matrix<double,_remora::row_major,_remora::cpu_tag>::raw_storage
                       (in_stack_fffffffffffffec0);
  local_68 = local_60.values;
  local_74 = 1;
  local_70 = (pointer)row_major::index_M<unsigned_long,int>(&local_60.leading_dimension,&local_74);
  local_84 = 1;
  iVar2 = row_major::index_m<unsigned_long,int>(&local_60.leading_dimension,&local_84);
  local_80 = (matrix<double,_remora::row_major,_remora::cpu_tag> *)(long)iVar2;
  for (local_90 = 0; local_90 < local_50; local_90 = local_90 + 1) {
    local_a0 = local_40 + local_90 * -0x3fc;
    puVar3 = std::min<unsigned_long>
                       (&trmm_impl<remora::dense_matrix_adaptor<const_double,_remora::row_major,_remora::dense_tag,_remora::cpu_tag>,_remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::triangular_tag<false,_false>_>
                         ::BC,&local_a0);
    local_98 = *puVar3;
    for (local_a8 = (matrix_expression<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
                     *)0x0; local_a8 < local_48; local_a8 = local_a8 + 1) {
      local_b0 = local_48 + (-1 - (long)local_a8);
      local_c0 = local_38 + (long)local_b0 * -0x80;
      puVar3 = std::min<unsigned_long>
                         (&trmm_impl<remora::dense_matrix_adaptor<const_double,_remora::row_major,_remora::dense_tag,_remora::cpu_tag>,_remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::triangular_tag<false,_false>_>
                           ::AC,&local_c0);
      local_b8 = *puVar3;
      subrange<remora::matrix<double,remora::row_major,remora::cpu_tag>,remora::cpu_tag>
                (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
                 (size_t)in_stack_fffffffffffffee8,(size_t)in_stack_fffffffffffffee0);
      pack_B_dense<remora::dense_matrix_adaptor<double,remora::row_major,remora::dense_tag,remora::cpu_tag>,double,remora::bindings::trmm_block_size<double>>
                (local_e0,local_30);
      dense_matrix_adaptor<double,_remora::row_major,_remora::dense_tag,_remora::cpu_tag>::clear
                (in_stack_fffffffffffffee0);
      pmVar1 = local_48;
      for (in_stack_ffffffffffffff00 = local_b0; in_stack_ffffffffffffff00 < pmVar1;
          in_stack_ffffffffffffff00 = in_stack_ffffffffffffff00 + 1) {
        in_stack_fffffffffffffef0 = local_38 + (long)in_stack_ffffffffffffff00 * -0x80;
        puVar3 = std::min<unsigned_long>
                           (&trmm_impl<remora::dense_matrix_adaptor<const_double,_remora::row_major,_remora::dense_tag,_remora::cpu_tag>,_remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::triangular_tag<false,_false>_>
                             ::AC,(unsigned_long *)&stack0xfffffffffffffef0);
        in_stack_fffffffffffffef8 = *puVar3;
        subrange<remora::dense_matrix_adaptor<double_const,remora::row_major,remora::dense_tag,remora::cpu_tag>,remora::cpu_tag>
                  ((matrix_expression<remora::dense_matrix_adaptor<const_double,_remora::row_major,_remora::dense_tag,_remora::cpu_tag>,_remora::cpu_tag>
                    *)in_stack_fffffffffffffee0,(size_t)in_stack_fffffffffffffed8,
                   in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                   (size_t)in_stack_fffffffffffffec0);
        if (in_stack_ffffffffffffff00 == local_b0) {
          pack_A_triangular<remora::dense_matrix_adaptor<double_const,remora::row_major,remora::dense_tag,remora::cpu_tag>,double,remora::bindings::trmm_block_size<double>,false>
                    (&stack0xfffffffffffffed0,local_28);
        }
        else {
          pack_A_dense<remora::dense_matrix_adaptor<double_const,remora::row_major,remora::dense_tag,remora::cpu_tag>,double,remora::bindings::trmm_block_size<double>>
                    (&stack0xfffffffffffffed0,local_28);
        }
        in_stack_fffffffffffffeb8 = local_70;
        in_stack_fffffffffffffec0 = local_80;
        mgemm<double,double,remora::bindings::trmm_block_size<double>>
                  (0x3ff0000000000000,in_stack_fffffffffffffef8,local_98,local_b8,local_28,local_30,
                   local_68 +
                   (long)in_stack_ffffffffffffff00 * 0x80 * (long)local_70 +
                   local_90 * 0x3fc * (long)local_80);
      }
    }
  }
  boost::alignment::aligned_allocator<double,_64UL>::deallocate
            ((aligned_allocator<double,_64UL> *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
             0x11eea3);
  boost::alignment::aligned_allocator<double,_64UL>::deallocate
            ((aligned_allocator<double,_64UL> *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
             0x11eebd);
  return;
}

Assistant:

void trmm_impl(
	matrix_expression<E1, cpu_tag> const& e1,
	matrix_expression<E2, cpu_tag> & e2,
	Triangular t
){
	typedef typename std::common_type<typename E1::value_type, typename E2::value_type>::type value_type;
	typedef trmm_block_size<value_type> block_size;

	static const std::size_t AC = block_size::lhs_block_size;
	static const std::size_t BC = block_size::rhs_column_size;

	//obtain uninitialized aligned storage
	boost::alignment::aligned_allocator<value_type,block_size::block::align> allocator;
	value_type* A = allocator.allocate(AC * AC);
	value_type* B = allocator.allocate(AC * BC);

	//figure out number of blocks to use
	const std::size_t  M = e1().size1();
	const std::size_t  N = e2().size2();
	const std::size_t Ab = (M+AC-1) / AC;
	const std::size_t Bb = (N+BC-1) / BC;

	//get access to raw storage of B
	auto storageB = e2().raw_storage();
	auto Bpointer = storageB.values;
	const std::size_t stride1 = E2::orientation::index_M(storageB.leading_dimension,1);
	const std::size_t stride2 = E2::orientation::index_m(storageB.leading_dimension,1);

	for (std::size_t j = 0; j < Bb; ++j) {//columns of B
		std::size_t nc = std::min(BC, N - j * BC);
		//We have to make use of the triangular nature of B and the fact that rhs and storage are the same matrix
		//for upper triangular matrices we can compute whole columns of A starting from the first
		//until we reach the block on the diagonal, where we stop.
		//for lower triangular matrices we start with the last column instead.
		for (std::size_t k0 = 0; k0< Ab; ++k0){//row-blocks of B = column blocks of A.
			std::size_t k = Triangular::is_upper? k0: Ab-k0-1;
			std::size_t kc = std::min(AC, M - k * AC);
			//read block of B
			auto Bs = subrange(e2, k*AC, k*AC + kc, j * BC, j * BC + nc );
			pack_B_dense(Bs, B, block_size());
			Bs.clear();//its going to be overwritten with the result

			//apply block of B to all blocks of A needing it. we will overwrite the real B block as a result of this.
			//this is okay as the block is stored as argument
			std::size_t i_start = Triangular::is_upper? 0: k;
			std::size_t i_end = Triangular::is_upper? k+1: Ab;
			for (std::size_t i = i_start; i < i_end; ++i) {
				std::size_t mc = std::min(AC, M - i * AC);
				auto As = subrange(e1, i * AC, i * AC + mc, k * AC, k * AC + kc);
				if(i == k){
					pack_A_triangular(As, A, block_size(), t);
				}else
					pack_A_dense(As, A, block_size());

				mgemm(
					mc, nc, kc, value_type(1.0), A, B,
					&Bpointer[i*AC * stride1 + j*BC * stride2], stride1, stride2, block_size()
				);
			}
		}
	}
	//free storage
	allocator.deallocate(A,AC * AC);
	allocator.deallocate(B,AC * BC);
}